

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.hpp
# Opt level: O0

string * __thiscall cinatra::cookie::to_string_abi_cxx11_(cookie *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string_view sVar2;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  time_point in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::string(in_RSI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_RSI,(size_type)in_RDI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
  if ((int)in_RSI[6]._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x186f78
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x186fca
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18700c
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
    }
    sVar2._M_str = (char *)in_stack_ffffffffffffff78;
    sVar2._M_len = (size_t)in_stack_ffffffffffffff80.__d.__r;
    if (in_RSI[6]._M_dataplus._M_p != (pointer)0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      time((time_t *)0x0);
      std::chrono::_V2::system_clock::from_time_t((time_t)in_stack_ffffffffffffff78);
      sVar2 = get_gmt_time_str(in_stack_ffffffffffffff80);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                (in_RSI,(basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
    }
    if ((in_RSI[6]._M_string_length & 0x100000000) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar2._M_len,
                 sVar2._M_str);
    }
    if ((in_RSI[6]._M_string_length & 0x10000000000) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar2._M_len,
                 sVar2._M_str);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x187159
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1871a8
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1871fa
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18724f
                      );
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    }
    if (in_RSI[6]._M_dataplus._M_p != (pointer)0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
      std::__cxx11::to_string(in_stack_ffffffffffffffb8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,in_stack_ffffffffffffff78);
      std::__cxx11::string::~string(in_stack_ffffffffffffff70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    }
    if ((in_RSI[6]._M_string_length & 0x100000000) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    }
    if ((in_RSI[6]._M_string_length & 0x10000000000) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80.__d.__r,(char *)in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

std::string to_string() const {
    std::string result;
    result.reserve(256);
    result.append(name_);
    result.append("=");
    if (version_ == 0) {
      // Netscape cookie
      result.append(value_);
      if (!domain_.empty()) {
        result.append("; domain=");
        result.append(domain_);
      }
      if (!path_.empty()) {
        result.append("; path=");
        result.append(path_);
      }
      if (!priority_.empty()) {
        result.append("; Priority=");
        result.append(priority_);
      }
      if (max_age_ != -1) {
        result.append("; expires=");
        result.append(get_gmt_time_str(std::chrono::system_clock::from_time_t(
            max_age_ + std::time(nullptr))));
      }
      if (secure_) {
        result.append("; secure");
      }
      if (http_only_) {
        result.append("; HttpOnly");
      }
    }
    else {
      // RFC 2109 cookie
      result.append("\"");
      result.append(value_);
      result.append("\"");
      if (!comment_.empty()) {
        result.append("; Comment=\"");
        result.append(comment_);
        result.append("\"");
      }
      if (!domain_.empty()) {
        result.append("; Domain=\"");
        result.append(domain_);
        result.append("\"");
      }
      if (!path_.empty()) {
        result.append("; Path=\"");
        result.append(path_);
        result.append("\"");
      }
      if (!priority_.empty()) {
        result.append("; Priority=\"");
        result.append(priority_);
        result.append("\"");
      }

      if (max_age_ != -1) {
        result.append("; Max-Age=\"");
        result.append(std::to_string(max_age_));
        result.append("\"");
      }
      if (secure_) {
        result.append("; secure");
      }
      if (http_only_) {
        result.append("; HttpOnly");
      }
      result.append("; Version=\"1\"");
    }
    return result;
  }